

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginMenu(char *label,bool enabled)

{
  uint uVar1;
  int iVar2;
  ImGuiID IVar3;
  ImGuiWindow *this;
  ImVec2 IVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ImU32 col;
  undefined7 extraout_var;
  ImGuiPopupData *pIVar9;
  uint *puVar10;
  byte bVar11;
  byte bVar12;
  undefined7 in_register_00000031;
  bool bVar13;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  ImGuiWindow *this_00;
  float fVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar19;
  ImVec2 IVar20;
  ImVec2 IVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  ImRect IVar25;
  ImGuiID id;
  uint local_b8;
  uint local_b4;
  ImVec2 ta;
  ImVec2 local_94;
  float local_8c;
  undefined1 local_88 [8];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [16];
  ImGuiWindow *local_60;
  undefined1 local_58 [16];
  ImGuiWindow **local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar5 = GImGui;
  local_78._0_4_ = (int)CONCAT71(in_register_00000031,enabled);
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  bVar6 = IsPopupOpen(id);
  uVar1 = this->Flags;
  bVar7 = ImVector<unsigned_int>::contains(&pIVar5->MenusIdSubmittedThisFrame,&id);
  if (bVar7) {
    if (!bVar6) {
      (pIVar5->NextWindowData).Flags = 0;
      return false;
    }
    goto LAB_0017b32d;
  }
  local_b8 = (uint)CONCAT71(extraout_var,bVar6);
  ImVector<unsigned_int>::push_back(&pIVar5->MenusIdSubmittedThisFrame,&id);
  IVar4 = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar17 = IVar4.x;
  fVar22 = IVar4.y;
  if (((this->Flags & 0x4000000) == 0) &&
     (iVar2 = (pIVar5->BeginPopupStack).Size, iVar2 < (pIVar5->OpenPopupStack).Size)) {
    uStack_80 = extraout_XMM0_Dc;
    local_88._0_4_ = IVar4.x;
    local_88._4_4_ = IVar4.y;
    uStack_7c = extraout_XMM0_Dd;
    pIVar9 = ImVector<ImGuiPopupData>::operator[](&pIVar5->OpenPopupStack,iVar2);
    IVar3 = pIVar9->OpenParentId;
    puVar10 = ImVector<unsigned_int>::back(&this->IDStack);
    local_60 = pIVar5->NavWindow;
    bVar6 = IVar3 == *puVar10;
    bVar15 = local_78[0];
    if (bVar6) {
      pIVar5->NavWindow = this;
    }
    fVar17 = (float)local_88._0_4_;
    fVar22 = (float)local_88._4_4_;
    uVar18 = uStack_80;
    uVar19 = uStack_7c;
  }
  else {
    local_60 = pIVar5->NavWindow;
    bVar6 = false;
    bVar15 = local_78[0];
    uVar18 = extraout_XMM0_Dc;
    uVar19 = extraout_XMM0_Dd;
  }
  local_48 = &pIVar5->NavWindow;
  local_94.x = (this->DC).CursorPos.x;
  fVar24 = (this->DC).CursorPos.y;
  local_78 = ZEXT416((uint)local_94.x);
  bVar7 = local_b8._0_1_;
  local_b4 = local_b8 & 0xff;
  if ((this->DC).LayoutType == 0) {
    local_78 = ZEXT416((uint)((local_94.x + -1.0) -
                             (float)(int)((pIVar5->Style).ItemSpacing.x * 0.5)));
    local_58 = ZEXT416((uint)(fVar24 - (pIVar5->Style).FramePadding.y));
    local_88._4_4_ = fVar22;
    local_88._0_4_ = fVar17;
    uStack_80 = uVar18;
    uStack_7c = uVar19;
    local_94.y = ImGuiWindow::MenuBarHeight(this);
    local_94.y = local_94.y + (float)local_58._0_4_;
    local_94.x = (float)local_78._0_4_;
    fVar17 = (pIVar5->Style).ItemSpacing.x;
    (this->DC).CursorPos.x = (float)(int)(fVar17 * 0.5) + (this->DC).CursorPos.x;
    ta.y = (pIVar5->Style).ItemSpacing.y;
    ta.x = fVar17 + fVar17;
    PushStyleVar(0xd,&ta);
    ta.y = 0.0;
    ta.x = (float)local_88._0_4_;
    bVar7 = Selectable(label,bVar7,(uint)(bVar15 ^ 1) * 8 + 0x300001,&ta);
    PopStyleVar(1);
    (this->DC).CursorPos.x =
         (float)(int)((pIVar5->Style).ItemSpacing.x * -0.5) + (this->DC).CursorPos.x;
  }
  else {
    local_94.y = fVar24 - (pIVar5->Style).WindowPadding.y;
    local_58 = ZEXT416((uint)fVar24);
    local_8c = ImGuiMenuColumns::DeclColumns
                         (&(this->DC).MenuColumns,fVar17,0.0,(float)(int)(pIVar5->FontSize * 1.2));
    IVar4 = GetContentRegionAvail();
    fVar17 = IVar4.x - local_8c;
    _local_88 = ZEXT416(~-(uint)(fVar17 <= 0.0) & (uint)fVar17);
    ta.y = 0.0;
    ta.x = local_8c;
    bVar7 = Selectable(label,bVar7,(uint)(bVar15 ^ 1) * 8 + 0xb00001,&ta);
    col = GetColorU32((uint)(bVar15 ^ 1),1.0);
    IVar4.y = (float)local_58._0_4_ + 0.0;
    IVar4.x = (float)local_78._0_4_ +
              pIVar5->FontSize * 0.3 + (float)local_88._0_4_ + (this->DC).MenuColumns.Pos[2];
    RenderArrow(this->DrawList,IVar4,col,1,1.0);
  }
  if (bVar15 == 0) {
    bVar8 = false;
  }
  else {
    bVar8 = ItemHoverable(&(this->DC).LastItemRect,id);
  }
  if (bVar6 != false) {
    *local_48 = local_60;
  }
  if ((this->DC).LayoutType == 1) {
    iVar2 = (pIVar5->BeginPopupStack).Size;
    if (iVar2 < (pIVar5->OpenPopupStack).Size) {
      pIVar9 = ImVector<ImGuiPopupData>::operator[](&pIVar5->OpenPopupStack,iVar2);
      if (pIVar9->SourceWindow == this) {
        pIVar9 = ImVector<ImGuiPopupData>::operator[]
                           (&pIVar5->OpenPopupStack,(pIVar5->BeginPopupStack).Size);
        this_00 = pIVar9->Window;
      }
      else {
        this_00 = (ImGuiWindow *)0x0;
      }
    }
    else {
      this_00 = (ImGuiWindow *)0x0;
    }
    bVar6 = true;
    if (((pIVar5->HoveredWindow == this) && (this_00 != (ImGuiWindow *)0x0)) &&
       ((this->Flags & 0x400) == 0)) {
      IVar25 = ImGuiWindow::Rect(this_00);
      IVar20 = IVar25.Max;
      IVar4 = (pIVar5->IO).MousePos;
      IVar21 = (pIVar5->IO).MouseDelta;
      fVar22 = IVar4.x - IVar21.x;
      ta.y = IVar4.y - IVar21.y;
      fVar17 = (this_00->Pos).x;
      IVar21.y = IVar25.Max.y;
      local_38.x = IVar25.Max.x;
      if (fVar17 < (this->Pos).x || fVar17 == (this->Pos).x) {
        fVar17 = 0.5;
      }
      else {
        IVar21.x = IVar25.Min.x;
        fVar17 = -0.5;
        local_38.x = IVar25.Min.x;
        IVar20 = IVar21;
      }
      fVar23 = ABS(fVar22 - local_38.x) * 0.3;
      fVar24 = 30.0;
      if (fVar23 <= 30.0) {
        fVar24 = fVar23;
      }
      fVar24 = (float)(-(uint)(fVar23 < 5.0) & 0x40a00000 | ~-(uint)(fVar23 < 5.0) & (uint)fVar24);
      ta.x = fVar17 + fVar22;
      fVar17 = (IVar25.Min.y - fVar24) - ta.y;
      if (fVar17 <= -100.0) {
        fVar17 = -100.0;
      }
      local_38.y = fVar17 + ta.y;
      fVar17 = (IVar20.y + fVar24) - ta.y;
      if (100.0 <= fVar17) {
        fVar17 = 100.0;
      }
      local_40.x = IVar20.x;
      local_40.y = fVar17 + ta.y;
      bVar6 = ImTriangleContainsPoint(&ta,&local_38,&local_40,&(pIVar5->IO).MousePos);
      bVar6 = !bVar6;
    }
    bVar11 = (byte)local_b8 ^ 1;
    if (((bVar8 | bVar11) == 1) || (pIVar5->HoveredWindow != this)) {
      bVar12 = 0;
    }
    else {
      bVar12 = (pIVar5->HoveredIdPreviousFrame != id && pIVar5->HoveredIdPreviousFrame != 0) & bVar6
      ;
    }
    bVar13 = (bool)(bVar7 & bVar11 & bVar8);
    if (bVar8 == false) {
      bVar6 = bVar13;
    }
    if ((byte)local_b8 != 0) {
      bVar6 = bVar13;
    }
    if (bVar7 != false) {
      bVar6 = bVar13;
    }
    bVar7 = pIVar5->NavActivateId != id;
    if (bVar7) {
      bVar11 = bVar6;
    }
    uVar16 = (uint)bVar12;
    if (!bVar7) {
      uVar16 = local_b4;
    }
    bVar14 = (byte)uVar16;
    uVar16 = local_b8;
    if (((pIVar5->NavId == id) && (pIVar5->NavMoveRequest == true)) &&
       (bVar12 = bVar14, pIVar5->NavMoveDir == 1)) {
LAB_0017b2a4:
      bVar14 = bVar12;
      uVar16 = local_b8;
      NavMoveRequestCancel();
      bVar11 = 1;
    }
  }
  else {
    bVar12 = (byte)local_b8;
    if (bVar7 == false) {
      if ((byte)(bVar12 | bVar6 & bVar8 ^ 1U) == 1) {
        uVar16 = local_b8;
        if ((pIVar5->NavId == id) && (pIVar5->NavMoveRequest == true)) {
          bVar14 = 0;
          bVar12 = 0;
          if (pIVar5->NavMoveDir == 3) goto LAB_0017b2a4;
          bVar11 = 0;
          goto LAB_0017b2b2;
        }
        bVar11 = 0;
      }
      else {
        bVar11 = 1;
        uVar16 = 0;
      }
      bVar14 = 0;
    }
    else {
      bVar14 = bVar6 & bVar7 & bVar12;
      bVar11 = bVar14 ^ 1;
      uVar16 = (uint)(bVar12 ^ bVar14);
    }
  }
LAB_0017b2b2:
  if (((bVar15 == 0) || (bVar14 != 0)) && (bVar6 = IsPopupOpen(id), bVar6)) {
    ClosePopupToLevel((pIVar5->BeginPopupStack).Size,true);
  }
  if ((((~bVar11 | (byte)uVar16) & 1) == 0) &&
     ((pIVar5->BeginPopupStack).Size < (pIVar5->OpenPopupStack).Size)) {
    OpenPopup(label);
    return false;
  }
  if ((bVar11 & 1) == 0) {
    if ((byte)uVar16 == 0) {
      (pIVar5->NextWindowData).Flags = 0;
      return false;
    }
  }
  else {
    OpenPopup(label);
  }
  ta.x = 0.0;
  ta.y = 0.0;
  SetNextWindowPos(&local_94,1,&ta);
LAB_0017b32d:
  bVar6 = BeginPopupEx(id,(uint)((uVar1 & 0x14000000) != 0) << 0x18 | 0x10080145);
  return bVar6;
}

Assistant:

bool ImGui::BeginMenu(const char* label, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    bool menu_is_open = IsPopupOpen(id);

    // Sub-menus are ChildWindow so that mouse can be hovering across them (otherwise top-most popup menu would steal focus and not allow hovering on parent menu)
    ImGuiWindowFlags flags = ImGuiWindowFlags_ChildMenu | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus;
    if (window->Flags & (ImGuiWindowFlags_Popup | ImGuiWindowFlags_ChildMenu))
        flags |= ImGuiWindowFlags_ChildWindow;

    // If a menu with same the ID was already submitted, we will append to it, matching the behavior of Begin().
    // We are relying on a O(N) search - so O(N log N) over the frame - which seems like the most efficient for the expected small amount of BeginMenu() calls per frame.
    // If somehow this is ever becoming a problem we can switch to use e.g. a ImGuiStorager mapping key to last frame used.
    if (g.MenusIdSubmittedThisFrame.contains(id))
    {
        if (menu_is_open)
            menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
        else
            g.NextWindowData.ClearFlags();          // we behave like Begin() and need to consume those values
        return menu_is_open;
    }

    // Tag menu as used. Next time BeginMenu() with same ID is called it will append to existing menu
    g.MenusIdSubmittedThisFrame.push_back(id);

    ImVec2 label_size = CalcTextSize(label, NULL, true);
    bool pressed;
    bool menuset_is_open = !(window->Flags & ImGuiWindowFlags_Popup) && (g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].OpenParentId == window->IDStack.back());
    ImGuiWindow* backed_nav_window = g.NavWindow;
    if (menuset_is_open)
        g.NavWindow = window;  // Odd hack to allow hovering across menus of a same menu-set (otherwise we wouldn't be able to hover parent)

    // The reference position stored in popup_pos will be used by Begin() to find a suitable position for the child menu,
    // However the final position is going to be different! It is chosen by FindBestWindowPosForPopup().
    // e.g. Menus tend to overlap each other horizontally to amplify relative Z-ordering.
    ImVec2 popup_pos, pos = window->DC.CursorPos;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Menu inside an horizontal menu bar
        // Selectable extend their highlight by half ItemSpacing in each direction.
        // For ChildMenu, the popup position will be overwritten by the call to FindBestWindowPosForPopup() in Begin()
        popup_pos = ImVec2(pos.x - 1.0f - IM_FLOOR(style.ItemSpacing.x * 0.5f), pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(style.ItemSpacing.x * 2.0f, style.ItemSpacing.y));
        float w = label_size.x;
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_SelectOnClick | ImGuiSelectableFlags_DontClosePopups | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        PopStyleVar();
        window->DC.CursorPos.x += IM_FLOOR(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu inside a menu
        // (In a typical menu window where all items are BeginMenu() or MenuItem() calls, extra_w will always be 0.0f.
        //  Only when they are other items sticking out we're going to add spacing, yet only register minimum width into the layout system.
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float min_w = window->DC.MenuColumns.DeclColumns(label_size.x, 0.0f, IM_FLOOR(g.FontSize * 1.20f)); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - min_w);
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_SelectOnClick | ImGuiSelectableFlags_DontClosePopups | ImGuiSelectableFlags_SpanAvailWidth | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(min_w, 0.0f));
        ImU32 text_col = GetColorU32(enabled ? ImGuiCol_Text : ImGuiCol_TextDisabled);
        RenderArrow(window->DrawList, pos + ImVec2(window->DC.MenuColumns.Pos[2] + extra_w + g.FontSize * 0.30f, 0.0f), text_col, ImGuiDir_Right);
    }

    const bool hovered = enabled && ItemHoverable(window->DC.LastItemRect, id);
    if (menuset_is_open)
        g.NavWindow = backed_nav_window;

    bool want_open = false;
    bool want_close = false;
    if (window->DC.LayoutType == ImGuiLayoutType_Vertical) // (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Close menu when not hovering it anymore unless we are moving roughly in the direction of the menu
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_toward_other_child_menu = false;

        ImGuiWindow* child_menu_window = (g.BeginPopupStack.Size < g.OpenPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].SourceWindow == window) ? g.OpenPopupStack[g.BeginPopupStack.Size].Window : NULL;
        if (g.HoveredWindow == window && child_menu_window != NULL && !(window->Flags & ImGuiWindowFlags_MenuBar))
        {
            // FIXME-DPI: Values should be derived from a master "scale" factor.
            ImRect next_window_rect = child_menu_window->Rect();
            ImVec2 ta = g.IO.MousePos - g.IO.MouseDelta;
            ImVec2 tb = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
            ImVec2 tc = (window->Pos.x < child_menu_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
            float extra = ImClamp(ImFabs(ta.x - tb.x) * 0.30f, 5.0f, 30.0f);    // add a bit of extra slack.
            ta.x += (window->Pos.x < child_menu_window->Pos.x) ? -0.5f : +0.5f; // to avoid numerical issues
            tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -100.0f);                // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
            tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +100.0f);
            moving_toward_other_child_menu = ImTriangleContainsPoint(ta, tb, tc, g.IO.MousePos);
            //GetForegroundDrawList()->AddTriangleFilled(ta, tb, tc, moving_within_opened_triangle ? IM_COL32(0,128,0,128) : IM_COL32(128,0,0,128)); // [DEBUG]
        }
        if (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_toward_other_child_menu)
            want_close = true;

        if (!menu_is_open && hovered && pressed) // Click to open
            want_open = true;
        else if (!menu_is_open && hovered && !moving_toward_other_child_menu) // Hover to open
            want_open = true;

        if (g.NavActivateId == id)
        {
            want_close = menu_is_open;
            want_open = !menu_is_open;
        }
        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Right) // Nav-Right to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }
    else
    {
        // Menu bar
        if (menu_is_open && pressed && menuset_is_open) // Click an open menu again to close it
        {
            want_close = true;
            want_open = menu_is_open = false;
        }
        else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // First click to open, then hover to open others
        {
            want_open = true;
        }
        else if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Down) // Nav-Down to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }

    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id))
        ClosePopupToLevel(g.BeginPopupStack.Size, true);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags | ImGuiItemStatusFlags_Openable | (menu_is_open ? ImGuiItemStatusFlags_Opened : 0));

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.BeginPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        SetNextWindowPos(popup_pos, ImGuiCond_Always);
        menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    }
    else
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    }

    return menu_is_open;
}